

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

RSA * createPrivateRSA(string *key)

{
  void *buf;
  BIO *bp;
  BIO *keybio;
  char *c_string;
  RSA *rsa;
  string *key_local;
  
  c_string = (char *)0x0;
  rsa = (RSA *)key;
  buf = (void *)std::__cxx11::string::c_str();
  bp = BIO_new_mem_buf(buf,-1);
  if (bp == (BIO *)0x0) {
    key_local = (string *)0x0;
  }
  else {
    c_string = (char *)PEM_read_bio_RSAPrivateKey
                                 (bp,(RSA **)&c_string,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    key_local = (string *)c_string;
  }
  return (RSA *)key_local;
}

Assistant:

RSA* createPrivateRSA(const std::string &key) {
  RSA *rsa = NULL;
  const char* c_string = key.c_str();
  BIO * keybio = BIO_new_mem_buf(reinterpret_cast<const void*>(c_string), -1);
  if (keybio == NULL) { return NULL; }
  rsa = PEM_read_bio_RSAPrivateKey(keybio,
                                   &rsa,
                                   NULL,
                                   NULL);
  BIO_free(keybio);
  return rsa;
}